

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O0

void __thiscall DPlat::Serialize(DPlat *this,FArchive *arc)

{
  FArchive *pFVar1;
  FArchive *arc_local;
  DPlat *this_local;
  
  DMover::Serialize((DMover *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->m_Speed);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Low);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_High);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Wait);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Count);
  pFVar1 = ::operator<<(pFVar1,&this->m_Status);
  pFVar1 = ::operator<<(pFVar1,&this->m_OldStatus);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Crush);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Tag);
  ::operator<<(pFVar1,&this->m_Type);
  return;
}

Assistant:

void DPlat::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Speed
		<< m_Low
		<< m_High
		<< m_Wait
		<< m_Count
		<< m_Status
		<< m_OldStatus
		<< m_Crush
		<< m_Tag
		<< m_Type;
}